

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void C_ReadCVars(BYTE **demo_p)

{
  BYTE *pBVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  char *value;
  UCVarValue val;
  FBaseCVar *pFStack_38;
  DWORD filter;
  FBaseCVar *cvar;
  TArray<FBaseCVar_*,_FBaseCVar_*> cvars;
  char *breakpt;
  char *ptr;
  BYTE **demo_p_local;
  
  pBVar1 = *demo_p;
  breakpt = (char *)(pBVar1 + 1);
  if (*pBVar1 == '\\') {
    if (*breakpt == '\\') {
      TArray<FBaseCVar_*,_FBaseCVar_*>::TArray((TArray<FBaseCVar_*,_FBaseCVar_*> *)&cvar);
      cvars._8_8_ = strchr((char *)(pBVar1 + 2),0x5c);
      *(char *)cvars._8_8_ = '\0';
      uVar4 = strtoul((char *)(pBVar1 + 2),(char **)0x0,0x10);
      lVar2 = cvars._8_8_;
      *(undefined1 *)cvars._8_8_ = 0x5c;
      FilterCompactCVars((TArray<FBaseCVar_*,_FBaseCVar_*> *)&cvar,(DWORD)uVar4);
      while( true ) {
        breakpt = (char *)(lVar2 + 1);
        bVar3 = TArray<FBaseCVar_*,_FBaseCVar_*>::Pop
                          ((TArray<FBaseCVar_*,_FBaseCVar_*> *)&cvar,&stack0xffffffffffffffc8);
        if (!bVar3) break;
        cvars._8_8_ = strchr(breakpt,0x5c);
        if ((char *)cvars._8_8_ != (char *)0x0) {
          *(char *)cvars._8_8_ = '\0';
        }
        FBaseCVar::ForceSet(pFStack_38,(UCVarValue)breakpt,CVAR_String,false);
        if (cvars._8_8_ == 0) break;
        *(undefined1 *)cvars._8_8_ = 0x5c;
        lVar2 = cvars._8_8_;
      }
      TArray<FBaseCVar_*,_FBaseCVar_*>::~TArray((TArray<FBaseCVar_*,_FBaseCVar_*> *)&cvar);
    }
    else {
      while (pcVar5 = strchr(breakpt,0x5c), cvars._8_8_ = pcVar5, pcVar5 != (char *)0x0) {
        *pcVar5 = '\0';
        cvars._8_8_ = strchr(pcVar5 + 1,0x5c);
        if ((char *)cvars._8_8_ != (char *)0x0) {
          *(char *)cvars._8_8_ = '\0';
        }
        cvar_set(breakpt,pcVar5 + 1);
        *pcVar5 = '\\';
        if (cvars._8_8_ == 0) break;
        *(undefined1 *)cvars._8_8_ = 0x5c;
        breakpt = (char *)(cvars._8_8_ + 1);
      }
    }
    sVar6 = strlen((char *)*demo_p);
    *demo_p = *demo_p + sVar6 + 1;
  }
  return;
}

Assistant:

void C_ReadCVars (BYTE **demo_p)
{
	char *ptr = *((char **)demo_p);
	char *breakpt;

	if (*ptr++ != '\\')
		return;

	if (*ptr == '\\')
	{       // compact mode
		TArray<FBaseCVar *> cvars;
		FBaseCVar *cvar;
		DWORD filter;

		ptr++;
		breakpt = strchr (ptr, '\\');
		*breakpt = 0;
		filter = strtoul (ptr, NULL, 16);
		*breakpt = '\\';
		ptr = breakpt + 1;

		FilterCompactCVars (cvars, filter);

		while (cvars.Pop (cvar))
		{
			UCVarValue val;
			breakpt = strchr (ptr, '\\');
			if (breakpt)
				*breakpt = 0;
			val.String = ptr;
			cvar->ForceSet (val, CVAR_String);
			if (breakpt)
			{
				*breakpt = '\\';
				ptr = breakpt + 1;
			}
			else
				break;
		}
	}
	else
	{
		char *value;

		while ( (breakpt = strchr (ptr, '\\')) )
		{
			*breakpt = 0;
			value = breakpt + 1;
			if ( (breakpt = strchr (value, '\\')) )
				*breakpt = 0;

			cvar_set (ptr, value);

			*(value - 1) = '\\';
			if (breakpt)
			{
				*breakpt = '\\';
				ptr = breakpt + 1;
			}
			else
			{
				break;
			}
		}
	}
	*demo_p += strlen (*((char **)demo_p)) + 1;
}